

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

bool __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::dispatch(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,string *url,char *method,application *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar5 = option::matches(&this->super_option,url,method);
  if (bVar5) {
    lVar6 = (long)this->select_[0];
    if (((lVar6 < 0) ||
        (ppVar3 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) >> 3) <=
        this->select_[0])) || ((long)ppVar3[lVar6].first == -1)) {
      pcVar7 = (char *)0x0;
      bVar4 = false;
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar7 = (this->super_option).match_.begin_;
      pcVar8 = pcVar7 + ppVar3[lVar6].first;
      pcVar7 = pcVar7 + ppVar3[lVar6].second;
      bVar4 = true;
    }
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    if (bVar4) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar8,pcVar7);
    }
    else {
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
    }
    lVar6 = (long)this->select_[1];
    if (((lVar6 < 0) ||
        (ppVar3 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) >> 3) <=
        this->select_[1])) || ((long)ppVar3[lVar6].first == -1)) {
      pcVar8 = (char *)0x0;
      pcVar7 = (char *)0x0;
      bVar4 = false;
    }
    else {
      pcVar7 = (this->super_option).match_.begin_;
      pcVar8 = pcVar7 + ppVar3[lVar6].first;
      pcVar7 = pcVar7 + ppVar3[lVar6].second;
      bVar4 = true;
    }
    paVar2 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    if (bVar4) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar8,pcVar7);
    }
    else {
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
    }
    if ((this->handle_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->handle_)._M_invoker)((_Any_data *)&this->handle_,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return bVar5;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					execute_handler(handle_);
					return true;
				}
				return false;
			}